

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O1

SQInteger __thiscall SQBlob::Write(SQBlob *this,void *buffer,SQInteger size)

{
  long lVar1;
  long n;
  
  lVar1 = this->_ptr + size;
  n = lVar1 - this->_size;
  if (n != 0 && this->_size <= lVar1) {
    GrowBufOf(this,n);
  }
  memcpy(this->_buf + this->_ptr,buffer,size);
  this->_ptr = this->_ptr + size;
  return size;
}

Assistant:

SQInteger Write(void *buffer, SQInteger size) {
        if(!CanAdvance(size)) {
            GrowBufOf(_ptr + size - _size);
        }
        memcpy(&_buf[_ptr], buffer, size);
        _ptr += size;
        return size;
    }